

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O3

MeshGL * CubeSTL(void)

{
  vector<float,_std::allocator<float>_> *this;
  int iVar1;
  iterator iVar2;
  iterator iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  uint uVar7;
  pointer puVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  MeshGL *in_RDI;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  mat3 triPos;
  MeshGL cubeIn;
  uint local_1d8;
  float local_1d4;
  uint local_1d0 [6];
  double local_1b8 [10];
  undefined1 local_168 [16];
  double local_158;
  ulong local_148;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  MeshGLP<float,_unsigned_int> local_118;
  
  local_138 = 0x3ff0000000000000;
  uStack_130 = 0x3ff0000000000000;
  local_128 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_1b8,1);
  manifold::Manifold::GetMeshGL((int)&local_118);
  manifold::Manifold::~Manifold((Manifold *)local_1b8);
  this = &in_RDI->vertProperties;
  memset(this,0,0xdc);
  in_RDI->numProp = 6;
  if ((int)((ulong)((long)local_118.triVerts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_118.triVerts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) / 3) != 0) {
    local_140 = &in_RDI->triVerts;
    uVar11 = 0;
    local_1d8 = 0;
    do {
      local_1b8[6] = 0.0;
      local_1b8[7] = 0.0;
      local_1b8[4] = 0.0;
      local_1b8[5] = 0.0;
      local_1b8[2] = 0.0;
      local_1b8[3] = 0.0;
      local_1b8[0] = 0.0;
      local_1b8[1] = 0.0;
      local_1b8[8] = 0.0;
      local_168._8_4_ = 2;
      local_168._0_8_ = 0x100000000;
      lVar13 = 0;
      puVar8 = local_118.triVerts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_148 = uVar11;
      do {
        iVar1 = *(int *)(local_168 + lVar13);
        local_1d0[0] = local_1d8;
        iVar2._M_current =
             (in_RDI->triVerts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (in_RDI->triVerts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (local_140,iVar2,local_1d0);
          puVar8 = local_118.triVerts.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *iVar2._M_current = local_1d8;
          (in_RDI->triVerts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        }
        local_1d8 = local_1d8 + 1;
        local_1d0[0] = 0;
        local_1d0[1] = 1;
        local_1d0[2] = 2;
        uVar7 = puVar8[uVar11 * 3 + (long)iVar1];
        lVar10 = 0x30;
        if (iVar1 == 1) {
          lVar10 = 0x18;
        }
        if (iVar1 == 0) {
          lVar10 = 0;
        }
        lVar12 = 0;
        do {
          iVar1 = *(int *)((long)local_1d0 + lVar12);
          lVar9 = 0;
          if (iVar1 != 0) {
            lVar9 = (ulong)(iVar1 != 1) * 8 + 8;
          }
          *(double *)((long)local_1b8 + lVar9 + lVar10) =
               (double)local_118.vertProperties.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar7 * local_118.numProp + iVar1];
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0xc);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      auVar14._0_8_ =
           (local_1b8[4] - local_1b8[1]) * (local_1b8[8] - local_1b8[2]) -
           (local_1b8[7] - local_1b8[1]) * (local_1b8[5] - local_1b8[2]);
      auVar14._8_8_ =
           (local_1b8[5] - local_1b8[2]) * (local_1b8[6] - local_1b8[0]) -
           (local_1b8[8] - local_1b8[2]) * (local_1b8[3] - local_1b8[0]);
      dVar4 = (local_1b8[3] - local_1b8[0]) * (local_1b8[7] - local_1b8[1]) -
              (local_1b8[6] - local_1b8[0]) * (local_1b8[4] - local_1b8[1]);
      dVar6 = SQRT(auVar14._8_8_ * auVar14._8_8_ + auVar14._0_8_ * auVar14._0_8_ + dVar4 * dVar4);
      auVar5._8_4_ = SUB84(dVar6,0);
      auVar5._0_8_ = dVar6;
      auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
      local_168 = divpd(auVar14,auVar5);
      local_158 = dVar4 / dVar6;
      local_1d0[0] = 0;
      local_1d0[1] = 1;
      local_1d0[2] = 2;
      lVar13 = 0;
      do {
        local_1d0[3] = 0;
        local_1d0[4] = 1;
        local_1d0[5] = 2;
        lVar10 = 0x30;
        if (*(int *)((long)local_1d0 + lVar13) == 1) {
          lVar10 = 0x18;
        }
        if (*(int *)((long)local_1d0 + lVar13) == 0) {
          lVar10 = 0;
        }
        lVar12 = 0;
        do {
          iVar1 = *(int *)((long)local_1d0 + lVar12 + 0xc);
          lVar9 = 0;
          if (iVar1 != 0) {
            lVar9 = (ulong)(iVar1 != 1) * 8 + 8;
          }
          local_1d4 = (float)*(double *)((long)local_1b8 + lVar9 + lVar10);
          iVar3._M_current =
               (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this,iVar3,&local_1d4);
          }
          else {
            *iVar3._M_current = local_1d4;
            (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0xc);
        local_1d0[3] = 0;
        local_1d0[4] = 1;
        local_1d0[5] = 2;
        lVar10 = 0;
        do {
          iVar1 = *(int *)((long)local_1d0 + lVar10 + 0xc);
          lVar12 = 0;
          if (iVar1 != 0) {
            lVar12 = (ulong)(iVar1 != 1) * 8 + 8;
          }
          local_1d4 = (float)*(double *)(local_168 + lVar12);
          iVar3._M_current =
               (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (this,iVar3,&local_1d4);
          }
          else {
            *iVar3._M_current = local_1d4;
            (in_RDI->vertProperties).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0xc);
        lVar13 = lVar13 + 4;
      } while (lVar13 != 0xc);
      uVar11 = local_148 + 1;
    } while (uVar11 < ((ulong)((long)local_118.triVerts.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_118.triVerts.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 &
                      0xffffffff));
  }
  uVar7 = manifold::Manifold::ReserveIDs(1);
  local_1b8[0] = (double)CONCAT44(local_1b8[0]._4_4_,uVar7);
  iVar2._M_current =
       (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&in_RDI->runOriginalID,iVar2,(uint *)local_1b8);
  }
  else {
    *iVar2._M_current = uVar7;
    (in_RDI->runOriginalID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&local_118);
  return in_RDI;
}

Assistant:

MeshGL CubeSTL() {
  const MeshGL cubeIn = Manifold::Cube(vec3(1), true).GetMeshGL();
  MeshGL cube;
  cube.numProp = 6;

  for (size_t tri = 0, vert = 0; tri < cubeIn.NumTri(); tri++) {
    mat3 triPos;
    for (const int i : {0, 1, 2}) {
      cube.triVerts.push_back(vert++);

      for (const int j : {0, 1, 2}) {
        triPos[i][j] =
            cubeIn
                .vertProperties[cubeIn.numProp * cubeIn.triVerts[3 * tri + i] +
                                j];
      }
    }

    const vec3 normal =
        la::normalize(la::cross(triPos[1] - triPos[0], triPos[2] - triPos[0]));
    for (const int i : {0, 1, 2}) {
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(triPos[i][j]);
      }
      for (const int j : {0, 1, 2}) {
        cube.vertProperties.push_back(normal[j]);
      }
    }
  }

  cube.runOriginalID.push_back(Manifold::ReserveIDs(1));

  return cube;
}